

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CXMLReaderImpl.h
# Opt level: O2

void __thiscall
irr::io::CXMLReaderImpl<char,_irr::io::IXMLBase>::parseCurrentNode
          (CXMLReaderImpl<char,_irr::io::IXMLBase> *this)

{
  char cVar1;
  char *start;
  bool bVar2;
  long lVar3;
  char *end;
  
  start = this->P;
  lVar3 = 0;
  end = start;
  while( true ) {
    if (*end == '\0') {
      return;
    }
    if (*end == '<') break;
    end = end + 1;
    this->P = end;
    lVar3 = lVar3 + 1;
  }
  if (0 < lVar3) {
    bVar2 = setText(this,start,end);
    if (bVar2) {
      return;
    }
    end = this->P;
  }
  this->P = end + 1;
  cVar1 = end[1];
  if (cVar1 == '!') {
    bVar2 = parseCDATA(this);
    if (bVar2) {
      return;
    }
    parseComment(this);
    return;
  }
  if (cVar1 == '?') {
    ignoreDefinition(this);
    return;
  }
  if (cVar1 != '/') {
    parseOpeningXMLElement(this);
    return;
  }
  parseClosingXMLElement(this);
  return;
}

Assistant:

void parseCurrentNode()
	{
		char_type* start = P;

		// move forward until '<' found
		while(*P != L'<' && *P)
			++P;

		if (!*P)
			return;

		if (P - start > 0)
		{
			// we found some text, store it
			if (setText(start, P))
				return;
		}

		++P;

		// based on current token, parse and report next element
		switch(*P)
		{
		case L'/':
			parseClosingXMLElement(); 
			break;
		case L'?':
			ignoreDefinition();	
			break;
		case L'!':
			if (!parseCDATA())
				parseComment();	
			break;
		default:
			parseOpeningXMLElement();
			break;
		}
	}